

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionPosition_line.cpp
# Opt level: O1

ChVector<double> * __thiscall
chrono::ChFunctionPosition_line::Get_p_dsds
          (ChVector<double> *__return_storage_ptr__,ChFunctionPosition_line *this,double s)

{
  element_type *peVar1;
  ChVector<double> resultA;
  ChVector<double> resultB;
  ChVector<double> result;
  double local_88;
  double dStack_80;
  double local_78;
  double local_68;
  double dStack_60;
  double local_58;
  double local_48;
  double dStack_40;
  double local_38;
  
  local_38 = 0.0;
  local_48 = 0.0;
  dStack_40 = 0.0;
  local_58 = 0.0;
  local_68 = 0.0;
  dStack_60 = 0.0;
  local_78 = 0.0;
  local_88 = 0.0;
  dStack_80 = 0.0;
  peVar1 = (this->trajectory_line).
           super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar1->super_ChGeometry)._vptr_ChGeometry[0xb])(peVar1,&local_48);
  peVar1 = (this->trajectory_line).
           super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar1->super_ChGeometry)._vptr_ChGeometry[0xb])(s + -0.0001,peVar1,&local_88);
  peVar1 = (this->trajectory_line).
           super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar1->super_ChGeometry)._vptr_ChGeometry[0xb])(s + 0.0001,peVar1,&local_68);
  __return_storage_ptr__->m_data[0] = 0.0;
  __return_storage_ptr__->m_data[1] = 0.0;
  __return_storage_ptr__->m_data[2] = 0.0;
  __return_storage_ptr__->m_data[0] = ((local_88 + local_68) - (local_48 + local_48)) * 100000000.0;
  __return_storage_ptr__->m_data[1] =
       ((dStack_80 + dStack_60) - (dStack_40 + dStack_40)) * 100000000.0;
  __return_storage_ptr__->m_data[2] = ((local_78 + local_58) - (local_38 + local_38)) * 100000000.0;
  return __return_storage_ptr__;
}

Assistant:

ChVector<> ChFunctionPosition_line::Get_p_dsds(double s) const {
	// note: same as not implementing the function and let the fallback default BDF numerical differentiation do similar computation... to remove?
	double tstep = BDF_STEP_HIGH;
	double tr_time = s;
    double tr_timeB = s + tstep;
    double tr_timeA = s - tstep;

    ChVector<> result, resultB, resultA;

    trajectory_line->Evaluate(result, tr_time);
    trajectory_line->Evaluate(resultA, tr_timeA);
    trajectory_line->Evaluate(resultB, tr_timeB);

    return (resultA + resultB - result * 2) * (4 / pow(2 * tstep, 2));
}